

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

PP_entry * __thiscall amrex::ParmParse::PP_entry::operator=(PP_entry *this,PP_entry *pe)

{
  Table *pTVar1;
  PP_entry *in_RSI;
  PP_entry *in_RDI;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *in_stack_00000008;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000070;
  
  if (in_RSI != in_RDI) {
    std::__cxx11::string::operator=((string *)in_RDI,(string *)in_RSI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_00000070,in_stack_00000068);
    in_RDI->m_table = (Table *)0x0;
    in_RDI->m_queried = (bool)(in_RSI->m_queried & 1);
    if (in_RSI->m_table != (Table *)0x0) {
      pTVar1 = (Table *)operator_new(0x18);
      std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
      list(in_stack_00000010,in_stack_00000008);
      in_RDI->m_table = pTVar1;
    }
  }
  return in_RDI;
}

Assistant:

ParmParse::PP_entry&
ParmParse::PP_entry::operator= (const PP_entry& pe)
{
    if ( &pe == this ) return *this;
    m_name = pe.m_name;
    m_vals = pe.m_vals;
    m_table = 0;
    m_queried = pe.m_queried;
    if ( pe.m_table )
    {
        m_table = new Table(*pe.m_table);
    }
    return *this;
}